

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int64_t GetPredictionCostCrossColorBlue
                  (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                  VP8LMultipliers prev_y,int green_to_blue,int red_to_blue,
                  uint32_t *accumulated_blue_histo)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int64_t cur_diff;
  uint32_t histo [256];
  uint32_t *counts;
  uint32_t *in_stack_fffffffffffffbd0;
  uint32_t local_428 [259];
  int local_1c;
  int local_18;
  int local_14;
  uint32_t *local_10;
  undefined2 local_6;
  byte local_4;
  undefined2 local_3;
  byte local_1;
  
  local_3 = (undefined2)in_R8D;
  local_1 = (byte)((uint)in_R8D >> 0x10);
  local_4 = (byte)((uint)in_R9D >> 0x10);
  local_6 = (undefined2)in_R9D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  counts = local_428;
  (*VP8LCollectColorBlueTransforms)
            (local_10,local_14,local_18,local_1c,(uint)cur_diff,histo[0],counts);
  lVar1 = PredictionCostCrossColor(in_stack_fffffffffffffbd0,counts);
  if (((uint)cur_diff & 0xff) == (uint)local_3._1_1_) {
    lVar1 = lVar1 + -0x1800000;
  }
  if (((uint)cur_diff & 0xff) == (uint)local_6._1_1_) {
    lVar1 = lVar1 + -0x1800000;
  }
  if ((histo[0] & 0xff) == (uint)local_1) {
    lVar1 = lVar1 + -0x1800000;
  }
  if ((histo[0] & 0xff) == (uint)local_4) {
    lVar1 = lVar1 + -0x1800000;
  }
  if ((uint)cur_diff == 0) {
    lVar1 = lVar1 + -0x1800000;
  }
  if (histo[0] == 0) {
    lVar1 = lVar1 + -0x1800000;
  }
  return lVar1;
}

Assistant:

static int64_t GetPredictionCostCrossColorBlue(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_blue,
    int red_to_blue, const uint32_t accumulated_blue_histo[256]) {
  uint32_t histo[256] = { 0 };
  int64_t cur_diff;

  VP8LCollectColorBlueTransforms(argb, stride, tile_width, tile_height,
                                 green_to_blue, red_to_blue, histo);

  cur_diff = PredictionCostCrossColor(accumulated_blue_histo, histo);
  if ((uint8_t)green_to_blue == prev_x.green_to_blue) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)green_to_blue == prev_y.green_to_blue) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)red_to_blue == prev_x.red_to_blue) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)red_to_blue == prev_y.red_to_blue) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (green_to_blue == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (red_to_blue == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  return cur_diff;
}